

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderConfig.cpp
# Opt level: O2

void glu::parseConfigBitsFromName(RenderConfig *config,char *renderCfgName)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  deBool dVar5;
  size_t sVar6;
  InternalError *this;
  long lVar7;
  char *pcVar8;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar4 = -0x10;
  do {
    lVar7 = lVar4;
    pcVar8 = renderCfgName;
    if (lVar7 + 0x18 == 0x80) goto LAB_008f744c;
    pcVar8 = *(char **)((long)&parseConfigBitsFromName::colorCfgs[0].blueBits + lVar7);
    dVar5 = deStringBeginsWith(renderCfgName,pcVar8);
    lVar4 = lVar7 + 0x18;
  } while (dVar5 == 0);
  uVar2 = *(undefined8 *)((long)&parseConfigBitsFromName::colorCfgs[1].name + lVar7);
  uVar3 = *(undefined8 *)((long)&parseConfigBitsFromName::colorCfgs[1].redBits + lVar7);
  config->redBits = (int)uVar2;
  config->greenBits = (int)((ulong)uVar2 >> 0x20);
  config->blueBits = (int)uVar3;
  config->alphaBits = (int)((ulong)uVar3 >> 0x20);
  sVar6 = strlen(pcVar8);
  pcVar8 = renderCfgName + sVar6;
LAB_008f744c:
  lVar4 = 0;
  do {
    lVar7 = lVar4;
    if (lVar7 + 0x10 == 0x50) goto LAB_008f7489;
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::depthCfgs[0].name + lVar7);
    dVar5 = deStringBeginsWith(pcVar8,pcVar1);
    lVar4 = lVar7 + 0x10;
  } while (dVar5 == 0);
  config->depthBits = *(int *)((long)&parseConfigBitsFromName::depthCfgs[0].depthSize + lVar7);
  sVar6 = strlen(pcVar1);
  pcVar8 = pcVar8 + sVar6;
LAB_008f7489:
  lVar4 = 0;
  do {
    lVar7 = lVar4;
    if (lVar7 + 0x10 == 0x40) goto LAB_008f74c6;
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::stencilCfgs[0].name + lVar7);
    dVar5 = deStringBeginsWith(pcVar8,pcVar1);
    lVar4 = lVar7 + 0x10;
  } while (dVar5 == 0);
  config->stencilBits = *(int *)((long)&parseConfigBitsFromName::stencilCfgs[0].stencilSize + lVar7)
  ;
  sVar6 = strlen(pcVar1);
  pcVar8 = pcVar8 + sVar6;
LAB_008f74c6:
  lVar4 = 0;
  do {
    lVar7 = lVar4;
    if (lVar7 + 0x10 == 0x70) goto LAB_008f7503;
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::multiSampleCfgs[0].name + lVar7);
    dVar5 = deStringBeginsWith(pcVar8,pcVar1);
    lVar4 = lVar7 + 0x10;
  } while (dVar5 == 0);
  config->numSamples =
       *(int *)((long)&parseConfigBitsFromName::multiSampleCfgs[0].numSamples + lVar7);
  sVar6 = strlen(pcVar1);
  pcVar8 = pcVar8 + sVar6;
LAB_008f7503:
  if (*pcVar8 != '\0') {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Invalid GL configuration: \'",&local_91);
    std::operator+(&local_70,&local_90,renderCfgName);
    std::operator+(&local_50,&local_70,"\'");
    tcu::InternalError::InternalError(this,&local_50);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void parseConfigBitsFromName (RenderConfig* config, const char* renderCfgName)
{
	const char*	cfgName	= renderCfgName;

	DE_ASSERT(config->redBits		== RenderConfig::DONT_CARE	&&
			  config->greenBits		== RenderConfig::DONT_CARE	&&
			  config->blueBits		== RenderConfig::DONT_CARE	&&
			  config->alphaBits		== RenderConfig::DONT_CARE	&&
			  config->depthBits		== RenderConfig::DONT_CARE	&&
			  config->stencilBits	== RenderConfig::DONT_CARE	&&
			  config->numSamples	== RenderConfig::DONT_CARE);

	static const struct
	{
		const char*	name;
		int			redBits;
		int			greenBits;
		int			blueBits;
		int			alphaBits;
	} colorCfgs[] =
	{
		{ "rgb888",		8, 8, 8, 0 },
		{ "rgba8888",	8, 8, 8, 8 },
		{ "rgb565",		5, 6, 5, 0 },
		{ "rgba4444",	4, 4, 4, 4 },
		{ "rgba5551",	5, 5, 5, 1 }
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, colorCfgs[ndx].name))
		{
			config->redBits		= colorCfgs[ndx].redBits;
			config->greenBits	= colorCfgs[ndx].greenBits;
			config->blueBits	= colorCfgs[ndx].blueBits;
			config->alphaBits	= colorCfgs[ndx].alphaBits;

			cfgName	+= strlen(colorCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char*	name;
		int			depthSize;
	} depthCfgs[] =
	{
		{ "d0",		0 },
		{ "d16",	16 },
		{ "d24",	24 },
		{ "d32",	32 }
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, depthCfgs[ndx].name))
		{
			config->depthBits = depthCfgs[ndx].depthSize;

			cfgName += strlen(depthCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char*	name;
		int			stencilSize;
	} stencilCfgs[] =
	{
		{ "s0",		 0 },
		{ "s8",		 8 },
		{ "s16",	16 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, stencilCfgs[ndx].name))
		{
			config->stencilBits = stencilCfgs[ndx].stencilSize;

			cfgName += strlen(stencilCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char*	name;
		int			numSamples;
	} multiSampleCfgs[] =
	{
		{ "ms0",	 0 },
		{ "ms16",	16 },
		{ "ms1",	 1 },
		{ "ms2",	 2 },
		{ "ms4",	 4 },
		{ "ms8",	 8 }
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(multiSampleCfgs); ndx++)
	{
		if (deStringBeginsWith(cfgName, multiSampleCfgs[ndx].name))
		{
			config->numSamples = multiSampleCfgs[ndx].numSamples;

			cfgName += strlen(multiSampleCfgs[ndx].name);
			break;
		}
	}

	if (cfgName[0] != 0)
		throw tcu::InternalError(std::string("Invalid GL configuration: '") + renderCfgName + "'");
}